

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * __thiscall ODDLParser::OpenDDLParser::parseStructure(OpenDDLParser *this,char *in,char *end)

{
  char *__s;
  char *in_00;
  allocator<char> local_51;
  string local_50;
  bool local_29;
  char *pcStack_28;
  bool error;
  char *end_local;
  char *in_local;
  OpenDDLParser *this_local;
  
  this_local = (OpenDDLParser *)in;
  if ((in != (char *)0x0) && (in != end)) {
    local_29 = false;
    pcStack_28 = end;
    end_local = in;
    in_local = (char *)this;
    end_local = lookForNextToken<char>(in,end);
    __s = Grammar::OpenBracketToken;
    if (*end_local == *Grammar::OpenBracketToken) {
      do {
        end_local = parseStructureBody(this,end_local,pcStack_28,&local_29);
        if (end_local == (char *)0x0) {
          return (char *)0x0;
        }
      } while (*end_local != *Grammar::CloseBracketToken);
      end_local = end_local + 1;
      end_local = lookForNextToken<char>(end_local,pcStack_28);
      if ((local_29 & 1U) == 0) {
        popNode(this);
      }
      this_local = (OpenDDLParser *)end_local;
    }
    else {
      in_00 = end_local + 1;
      end_local = in_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      logInvalidTokenError(in_00,&local_50,this->m_logCallback);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      this_local = (OpenDDLParser *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char *OpenDDLParser::parseStructure( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    bool error( false );
    in = lookForNextToken( in, end );
    if( *in == *Grammar::OpenBracketToken) {
        // loop over all children ( data and nodes )
        do {
            in = parseStructureBody( in, end, error );
            if(in == ddl_nullptr){
                return ddl_nullptr;
            }
        } while ( *in != *Grammar::CloseBracketToken);
        ++in;
    } else {
        ++in;
        logInvalidTokenError( in, std::string( Grammar::OpenBracketToken ), m_logCallback );
        return ddl_nullptr;
    }
    in = lookForNextToken( in, end );

    // pop node from stack after successful parsing
    if( !error ) {
        popNode();
    }

    return in;
}